

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::save_jpg_file(ConstPtr *image,string *filename,int quality)

{
  string *filename_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  invalid_argument *this;
  ImageBase *pIVar5;
  Exception *pEVar6;
  char *pcVar7;
  FILE *__stream;
  FileException *this_00;
  int *piVar8;
  TypedImageBase<unsigned_char> *this_01;
  const_reference local_390;
  JSAMPROW row_pointer;
  ImageData *pIStack_380;
  int row_stride;
  ImageData *data;
  string local_370 [32];
  undefined1 local_350 [8];
  jpeg_error_mgr jerr;
  jpeg_compress_struct cinfo;
  FILE *fp;
  string local_50 [52];
  int local_1c;
  string *psStack_18;
  int quality_local;
  string *filename_local;
  ConstPtr *image_local;
  
  local_1c = quality;
  psStack_18 = filename;
  filename_local = (string *)image;
  bVar1 = std::operator==(image,(nullptr_t)0x0);
  if (bVar1) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Null image given");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar2 = ImageBase::channels(pIVar5);
  if (iVar2 != 1) {
    pIVar5 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar2 = ImageBase::channels(pIVar5);
    if (iVar2 != 3) {
      fp._6_1_ = 1;
      pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_50,"Invalid image color space",(allocator *)((long)&fp + 7));
      util::Exception::Exception(pEVar6,(string *)local_50);
      fp._6_1_ = 0;
      __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
    }
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar7,"wb");
  if (__stream != (FILE *)0x0) {
    jerr._160_8_ = jpeg_std_error(local_350);
    jpeg_CreateCompress(&jerr.first_addon_message,0x50,0x248);
    jpeg_stdio_dest(&jerr.first_addon_message,__stream);
    pIVar5 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    ImageBase::width(pIVar5);
    pIVar5 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    uVar3 = ImageBase::height(pIVar5);
    pIVar5 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    ImageBase::channels(pIVar5);
    pIVar5 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar2 = ImageBase::channels(pIVar5);
    if ((iVar2 != 1) && (iVar2 != 3)) {
      jpeg_destroy_compress(&jerr.first_addon_message);
      fclose(__stream);
      data._6_1_ = 1;
      pEVar6 = (Exception *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_370,"Invalid image color space",(allocator *)((long)&data + 7));
      util::Exception::Exception(pEVar6,(string *)local_370);
      data._6_1_ = 0;
      __cxa_throw(pEVar6,&util::Exception::typeinfo,util::Exception::~Exception);
    }
    jpeg_set_defaults(&jerr.first_addon_message);
    jpeg_set_quality(&jerr.first_addon_message,local_1c,1);
    jpeg_start_compress(&jerr.first_addon_message,1);
    this_01 = &std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image)->super_TypedImageBase<unsigned_char>;
    pIStack_380 = TypedImageBase<unsigned_char>::get_data(this_01);
    pIVar5 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar2 = ImageBase::width(pIVar5);
    pIVar5 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    iVar4 = ImageBase::channels(pIVar5);
    row_pointer._4_4_ = iVar2 * iVar4;
    while ((uint)cinfo._332_4_ < uVar3) {
      local_390 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (pIStack_380,(ulong)(uint)(cinfo._332_4_ * row_pointer._4_4_));
      jpeg_write_scanlines(&jerr.first_addon_message,&local_390,1);
    }
    jpeg_finish_compress(&jerr.first_addon_message);
    jpeg_destroy_compress(&jerr.first_addon_message);
    fclose(__stream);
    return;
  }
  this_00 = (FileException *)__cxa_allocate_exception(0x48);
  filename_00 = psStack_18;
  piVar8 = __errno_location();
  pcVar7 = strerror(*piVar8);
  util::FileException::FileException(this_00,filename_00,pcVar7);
  __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
}

Assistant:

void
save_jpg_file (ByteImage::ConstPtr image, std::string const& filename, int quality)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    if (image->channels() != 1 && image->channels() != 3)
        throw util::Exception("Invalid image color space");

    FILE* fp = std::fopen(filename.c_str(), "wb");
    if (!fp)
        throw util::FileException(filename, std::strerror(errno));

    struct jpeg_compress_struct cinfo;
    struct jpeg_error_mgr jerr;

    /* Setup error handler and info object. */
    cinfo.err = jpeg_std_error(&jerr);
    jpeg_create_compress(&cinfo);
    jpeg_stdio_dest(&cinfo, fp);

    /* Specify image dimensions. */
    cinfo.image_width = image->width();
    cinfo.image_height = image->height();
    cinfo.input_components = image->channels();
    switch (image->channels())
    {
        case 1: cinfo.in_color_space = JCS_GRAYSCALE; break;
        case 3: cinfo.in_color_space = JCS_RGB; break;
        default:
        {
            jpeg_destroy_compress(&cinfo);
            std::fclose(fp);
            throw util::Exception("Invalid image color space");
        }
    }

    /* Set default compression parameters. */
    jpeg_set_defaults(&cinfo);
    jpeg_set_quality(&cinfo, quality, TRUE);
    jpeg_start_compress(&cinfo, TRUE);

    ByteImage::ImageData const& data = image->get_data();
    int row_stride = image->width() * image->channels();
    while (cinfo.next_scanline < cinfo.image_height)
    {
        JSAMPROW row_pointer = const_cast<JSAMPROW>(
            &data[cinfo.next_scanline * row_stride]);
        jpeg_write_scanlines(&cinfo, &row_pointer, 1);
    }
    jpeg_finish_compress(&cinfo);
    jpeg_destroy_compress(&cinfo);
    std::fclose(fp);
}